

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

NamespaceAliasDeclaration * __thiscall
soul::PoolAllocator::
allocate<soul::AST::NamespaceAliasDeclaration,soul::AST::Context&,soul::Identifier&,soul::AST::QualifiedIdentifier&,soul::pool_ptr<soul::AST::Expression>&>
          (PoolAllocator *this,Context *args,Identifier *args_1,QualifiedIdentifier *args_2,
          pool_ptr<soul::AST::Expression> *args_3)

{
  string *psVar1;
  Expression *pEVar2;
  SourceCodeText *pSVar3;
  PoolItem *pPVar4;
  
  pPVar4 = allocateSpaceForObject(this,0x48);
  psVar1 = args_1->name;
  pEVar2 = args_3->object;
  pPVar4->item = &PTR__ASTObject_002d4778;
  *(undefined4 *)&pPVar4->field_0x18 = 5;
  pSVar3 = (args->location).sourceCode.object;
  pPVar4[1].size = (size_t)pSVar3;
  if (pSVar3 != (SourceCodeText *)0x0) {
    (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
  }
  pPVar4[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar4[1].item = args->parentScope;
  pPVar4->item = &PTR__NamespaceAliasDeclaration_002d5870;
  *(string **)&pPVar4[1].field_0x18 = psVar1;
  pPVar4[2].size = (size_t)args_2;
  pPVar4[2].destructor = (DestructorFn *)pEVar2;
  pPVar4[2].item = (void *)0x0;
  pPVar4->destructor =
       allocate<soul::AST::NamespaceAliasDeclaration,_soul::AST::Context_&,_soul::Identifier_&,_soul::AST::QualifiedIdentifier_&,_soul::pool_ptr<soul::AST::Expression>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (NamespaceAliasDeclaration *)&pPVar4->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }